

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall
duckdb::ZSTDScanState::ScanPartial
          (ZSTDScanState *this,idx_t start_idx,Vector *result,idx_t offset,idx_t count)

{
  ZSTDVectorScanState *scan_state;
  ulong count_00;
  idx_t scanned;
  long lVar1;
  
  lVar1 = 0;
  for (; count != 0; count = count - count_00) {
    scan_state = LoadVector(this,lVar1 + start_idx >> 0xb,(ulong)((uint)(lVar1 + start_idx) & 0x7ff)
                           );
    count_00 = (scan_state->metadata).count - scan_state->scanned_count;
    if (count < count_00) {
      count_00 = count;
    }
    ScanInternal(this,scan_state,count_00,result,lVar1 + offset);
    lVar1 = lVar1 + count_00;
  }
  return;
}

Assistant:

void ScanPartial(idx_t start_idx, Vector &result, idx_t offset, idx_t count) {
		idx_t remaining = count;
		idx_t scanned = 0;
		while (remaining) {
			idx_t internal_offset;
			idx_t vector_idx = GetVectorIndex(start_idx + scanned, internal_offset);
			auto &scan_state = LoadVector(vector_idx, internal_offset);
			idx_t remaining_in_vector = scan_state.metadata.count - scan_state.scanned_count;
			idx_t to_scan = MinValue<idx_t>(remaining, remaining_in_vector);
			ScanInternal(scan_state, to_scan, result, offset + scanned);
			remaining -= to_scan;
			scanned += to_scan;
		}
		D_ASSERT(scanned == count);
	}